

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O1

void __thiscall
t_javame_generator::generate_get_field_desc(t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *ptVar2;
  ostream *poVar3;
  t_javame_generator *ptVar4;
  pointer pptVar5;
  string local_98;
  t_struct *local_78;
  string local_70;
  string local_50;
  
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"protected TField getFieldDesc(_Fields setField) {",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"switch (setField) {",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_78 = tstruct;
  if (pptVar5 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ptVar2 = *pptVar5;
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"case ",5);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ptVar4 = (t_javame_generator *)(ptVar2->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,ptVar4,
                 (pointer)((long)&(ptVar4->super_t_oop_generator).super_t_generator.
                                  _vptr_t_generator + (ptVar2->name_)._M_string_length));
      constant_name(&local_98,ptVar4,&local_50);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_98._M_dataplus._M_p,local_98._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  return ",9);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ptVar4 = (t_javame_generator *)(ptVar2->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,ptVar4,
                 (pointer)((long)&(ptVar4->super_t_oop_generator).super_t_generator.
                                  _vptr_t_generator + (ptVar2->name_)._M_string_length));
      constant_name(&local_98,ptVar4,&local_70);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_98._M_dataplus._M_p,local_98._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_FIELD_DESC;",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 !=
             (local_78->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"default:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"  throw new IllegalArgumentException(\"Unknown field id \" + setField);",0x45);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_javame_generator::generate_get_field_desc(ostream& out, t_struct* tstruct) {
  indent(out) << "protected TField getFieldDesc(_Fields setField) {" << endl;
  indent_up();

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  indent(out) << "switch (setField) {" << endl;
  indent_up();

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_field* field = (*m_iter);
    indent(out) << "case " << constant_name(field->get_name()) << ":" << endl;
    indent(out) << "  return " << constant_name(field->get_name()) << "_FIELD_DESC;" << endl;
  }

  indent(out) << "default:" << endl;
  indent(out) << "  throw new IllegalArgumentException(\"Unknown field id \" + setField);" << endl;

  indent_down();
  indent(out) << "}" << endl;

  indent_down();
  indent(out) << "}" << endl;
}